

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

string * __thiscall
higan::FileForRead::ReadLine_abi_cxx11_(string *__return_storage_ptr__,FileForRead *this)

{
  ssize_t sVar1;
  
  if (this->file_status_ == OPEN_SUCCESS) {
    sVar1 = Buffer::ReadFromFd(&this->cache_buffer_,this->read_fd_);
    if (sVar1 != -1) {
      Buffer::ReadLine_abi_cxx11_(__return_storage_ptr__,&this->cache_buffer_);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string FileForRead::ReadLine()
{
	if (ReadFileToBuffer(&cache_buffer_) == -1)
	{
		return "";
	}

	return cache_buffer_.ReadLine();
}